

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

void __thiscall
helics::TimeCoordinator::setProperty(TimeCoordinator *this,int intProperty,int propertyVal)

{
  Time propertyVal_00;
  
  if (intProperty == 0x103) {
    (this->info).maxIterations = propertyVal;
    return;
  }
  propertyVal_00.internalTimeCode = count_time<9,_long>::convert((double)propertyVal);
  setProperty(this,intProperty,propertyVal_00);
  return;
}

Assistant:

void TimeCoordinator::setProperty(int intProperty, int propertyVal)
{
    if (intProperty == defs::Properties::MAX_ITERATIONS) {
        info.maxIterations = propertyVal;
    } else {
        setProperty(intProperty, Time(static_cast<double>(propertyVal)));
    }
}